

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int saveCursorKey(BtCursor *pCur)

{
  undefined8 *puVar1;
  long lVar2;
  u32 uVar3;
  int iVar4;
  i64 iVar5;
  void *pBuf;
  int iVar6;
  
  if (pCur->curIntKey == '\0') {
    uVar3 = sqlite3BtreePayloadSize(pCur);
    pCur->nKey = (ulong)uVar3;
    pBuf = sqlite3Malloc((ulong)uVar3 + 0x11);
    if (pBuf == (void *)0x0) {
      iVar6 = 7;
    }
    else {
      iVar6 = 0;
      iVar4 = sqlite3BtreePayload(pCur,0,(u32)pCur->nKey,pBuf);
      if (iVar4 == 0) {
        lVar2 = pCur->nKey;
        puVar1 = (undefined8 *)((long)pBuf + lVar2);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined1 *)((long)pBuf + lVar2 + 0x10) = 0;
        pCur->pKey = pBuf;
      }
      else {
        sqlite3_free(pBuf);
        iVar6 = iVar4;
      }
    }
  }
  else {
    iVar5 = sqlite3BtreeIntegerKey(pCur);
    pCur->nKey = iVar5;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int saveCursorKey(BtCursor *pCur){
  int rc = SQLITE_OK;
  assert( CURSOR_VALID==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->curIntKey ){
    /* Only the rowid is required for a table btree */
    pCur->nKey = sqlite3BtreeIntegerKey(pCur);
  }else{
    /* For an index btree, save the complete key content. It is possible
    ** that the current key is corrupt. In that case, it is possible that
    ** the sqlite3VdbeRecordUnpack() function may overread the buffer by
    ** up to the size of 1 varint plus 1 8-byte value when the cursor 
    ** position is restored. Hence the 17 bytes of padding allocated 
    ** below. */
    void *pKey;
    pCur->nKey = sqlite3BtreePayloadSize(pCur);
    pKey = sqlite3Malloc( pCur->nKey + 9 + 8 );
    if( pKey ){
      rc = sqlite3BtreePayload(pCur, 0, (int)pCur->nKey, pKey);
      if( rc==SQLITE_OK ){
        memset(((u8*)pKey)+pCur->nKey, 0, 9+8);
        pCur->pKey = pKey;
      }else{
        sqlite3_free(pKey);
      }
    }else{
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  assert( !pCur->curIntKey || !pCur->pKey );
  return rc;
}